

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

bool __thiscall
miniros::MasterLink::getTopics
          (MasterLink *this,vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_> *topics)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  string *_name;
  string *_datatype;
  TopicInfo *in_RSI;
  bool in_stack_000000f7;
  RpcValue *in_stack_000000f8;
  size_t i;
  RpcValue *in_stack_00000108;
  string *in_stack_00000110;
  MasterLink *in_stack_00000118;
  string subgraph;
  RpcValue payload;
  RpcValue result;
  RpcValue args;
  value_type *in_stack_fffffffffffffe28;
  int i_00;
  TopicInfo *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe48;
  XmlRpcValue *in_stack_fffffffffffffe50;
  TopicInfo *this_00;
  allocator<char> *in_stack_fffffffffffffe60;
  ulong uVar4;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined2 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe72;
  undefined1 in_stack_fffffffffffffe73;
  undefined4 in_stack_fffffffffffffe74;
  XmlRpcValue *this_01;
  string local_158 [32];
  string local_138 [96];
  ulong local_d8;
  undefined4 local_d0;
  undefined1 local_c9 [37];
  Error local_a4 [6];
  allocator<char> local_89;
  string local_88 [48];
  XmlRpcValue local_58 [2];
  XmlRpcValue local_38;
  XmlRpcValue local_28;
  TopicInfo *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_28);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_58);
  this_node::getName_abi_cxx11_();
  XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)in_stack_fffffffffffffe30,
             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)
             CONCAT44(in_stack_fffffffffffffe74,
                      CONCAT13(in_stack_fffffffffffffe73,
                               CONCAT12(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70))),
             (XmlRpcValue *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4594f6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,
                      CONCAT13(in_stack_fffffffffffffe73,
                               CONCAT12(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70))),
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  std::allocator<char>::~allocator(&local_89);
  XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)in_stack_fffffffffffffe30,
             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)
             CONCAT44(in_stack_fffffffffffffe74,
                      CONCAT13(in_stack_fffffffffffffe73,
                               CONCAT12(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70))),
             (XmlRpcValue *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x459581);
  this_01 = (XmlRpcValue *)local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,
                      CONCAT13(in_stack_fffffffffffffe73,
                               CONCAT12(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70))),
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  local_a4[0] = execute(in_stack_00000118,in_stack_00000110,in_stack_00000108,(RpcValue *)i,
                        in_stack_000000f8,in_stack_000000f7);
  bVar1 = Error::operator_cast_to_bool(local_a4);
  bVar2 = bVar1 ^ 0xff;
  std::__cxx11::string::~string((string *)(local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  if ((bVar2 & 1) == 0) {
    std::vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_>::clear
              ((vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_> *)0x459777);
    local_d8 = 0;
    while( true ) {
      i_00 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      uVar4 = local_d8;
      iVar3 = XmlRpc::XmlRpcValue::size(this_01);
      if ((ulong)(long)iVar3 <= uVar4) break;
      this_00 = local_18;
      XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe30,i_00);
      _name = (string *)
              XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe30,i_00);
      _datatype = XmlRpc::XmlRpcValue::operator_cast_to_string_
                            ((XmlRpcValue *)in_stack_fffffffffffffe30);
      std::__cxx11::string::string(local_138,(string *)_datatype);
      XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe30,i_00);
      in_stack_fffffffffffffe30 =
           (TopicInfo *)
           XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe30,i_00);
      in_stack_fffffffffffffe28 =
           (value_type *)
           XmlRpc::XmlRpcValue::operator_cast_to_string_((XmlRpcValue *)in_stack_fffffffffffffe30);
      std::__cxx11::string::string(local_158,(string *)in_stack_fffffffffffffe28);
      TopicInfo::TopicInfo(this_00,_name,_datatype);
      std::vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_>::push_back
                ((vector<miniros::TopicInfo,_std::allocator<miniros::TopicInfo>_> *)
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      TopicInfo::~TopicInfo(in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_138);
      local_d8 = local_d8 + 1;
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  local_d0 = 1;
  std::__cxx11::string::~string(local_88);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x459975);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x459982);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45998f);
  return (bool)(local_1 & 1);
}

Assistant:

bool MasterLink::getTopics(std::vector<TopicInfo>& topics) const
{
  RpcValue args, result, payload;
  args[0] = this_node::getName();
  const std::string subgraph = "";
  args[1] = subgraph;

  if (!execute("getPublishedTopics", args, result, payload, true)) {
    return false;
  }

  topics.clear();
  for (size_t i = 0; i < payload.size(); i++) {
    topics.push_back(TopicInfo(std::string(payload[i][0]), std::string(payload[i][1])));
  }

  return true;
}